

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_define_syntax(sexp ctx,sexp x)

{
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp res;
  sexp in_stack_00000038;
  sexp in_stack_00000040;
  sexp in_stack_ffffffffffffffc8;
  sexp_sint_t n;
  sexp psVar1;
  undefined8 in_stack_ffffffffffffffe8;
  
  psVar1 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffd0,0,0x10);
  n = *(sexp_sint_t *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffd0;
  psVar1 = sexp_cons_op((sexp)in_stack_ffffffffffffffe8,psVar1,n,(sexp)&stack0xffffffffffffffe0,
                        in_stack_ffffffffffffffc8);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    psVar1 = analyze_bind_syntax(in_stack_00000040,in_stack_00000038,ctx,x._4_4_);
  }
  *(sexp_sint_t *)(in_RDI + 0x6080) = n;
  return psVar1;
}

Assistant:

static sexp analyze_define_syntax (sexp ctx, sexp x) {
  sexp res;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_list1(ctx, sexp_cdr(x));
  res = sexp_exceptionp(tmp) ? tmp : analyze_bind_syntax(tmp, ctx, ctx, 0);
  sexp_gc_release1(ctx);
  return res;
}